

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O3

GLuint glcts::findLSB(GLuint input)

{
  ulong uVar1;
  GLuint GVar2;
  ulong uVar3;
  
  if (input != 0) {
    GVar2 = 0;
    if ((input & 1) == 0) {
      GVar2 = 0;
      uVar3 = (ulong)input;
      do {
        GVar2 = GVar2 + 1;
        uVar1 = uVar3 & 2;
        uVar3 = uVar3 >> 1;
      } while (uVar1 == 0);
    }
    return GVar2;
  }
  return 0xffffffff;
}

Assistant:

static GLuint findLSB(GLuint input)
{
	if (!input)
	{
		return -1;
	}
	for (GLuint result = 0;; ++result)
	{
		if (input & 1)
		{
			return result;
		}
		input >>= 1;
	}
}